

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O0

Message * __thiscall
ki::protocol::dml::MessageManager::create_message
          (MessageManager *this,uint8_t service_id,uint8_t message_type)

{
  MessageModule *this_00;
  ostream *this_01;
  value_error *this_02;
  Message *pMVar1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  MessageModule *message_module;
  uint8_t message_type_local;
  uint8_t service_id_local;
  MessageManager *this_local;
  
  this_00 = get_module(this,service_id);
  if (this_00 == (MessageModule *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    this_01 = std::operator<<((ostream *)local_198,"No service exists with id: ");
    std::ostream::operator<<(this_01,(ushort)service_id);
    this_02 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_02,local_1c8,DML_INVALID_SERVICE);
    __cxa_throw(this_02,&value_error::typeinfo,value_error::~value_error);
  }
  pMVar1 = MessageModule::create_message(this_00,message_type);
  return pMVar1;
}

Assistant:

Message *MessageManager::create_message(uint8_t service_id, uint8_t message_type) const
	{
		auto *message_module = get_module(service_id);
		if (!message_module)
		{
			std::ostringstream oss;
			oss << "No service exists with id: " << (uint16_t)service_id;
			throw value_error(oss.str(), value_error::DML_INVALID_SERVICE);
		}

		return message_module->create_message(message_type);
	}